

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallPtrSet.cpp
# Opt level: O2

pair<const_void_*const_*,_bool> __thiscall
llvm::SmallPtrSetImplBase::insert_imp_big(SmallPtrSetImplBase *this,void *Ptr)

{
  uint uVar1;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  uint NewSize;
  pair<const_void_*const_*,_bool> pVar3;
  
  uVar1 = this->CurArraySize;
  if ((this->NumNonEmpty - this->NumTombstones) * 4 < uVar1 * 3) {
    NewSize = uVar1;
    if (uVar1 >> 3 <= uVar1 - this->NumNonEmpty) goto LAB_00151c74;
  }
  else {
    NewSize = 0x80;
    if (0x3f < uVar1) {
      NewSize = uVar1 * 2;
    }
  }
  Grow(this,NewSize);
LAB_00151c74:
  pVar3.first = FindBucketFor(this,Ptr);
  if (*pVar3.first == Ptr) {
    uVar2 = 0;
  }
  else {
    if (*pVar3.first == (void *)0xfffffffffffffffe) {
      this->NumTombstones = this->NumTombstones - 1;
    }
    else {
      this->NumNonEmpty = this->NumNonEmpty + 1;
    }
    *pVar3.first = Ptr;
    uVar2 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  pVar3._8_8_ = uVar2;
  return pVar3;
}

Assistant:

std::pair<const void *const *, bool>
SmallPtrSetImplBase::insert_imp_big(const void *Ptr) {
  if (LLVM_UNLIKELY(size() * 4 >= CurArraySize * 3)) {
    // If more than 3/4 of the array is full, grow.
    Grow(CurArraySize < 64 ? 128 : CurArraySize * 2);
  } else if (LLVM_UNLIKELY(CurArraySize - NumNonEmpty < CurArraySize / 8)) {
    // If fewer of 1/8 of the array is empty (meaning that many are filled with
    // tombstones), rehash.
    Grow(CurArraySize);
  }

  // Okay, we know we have space.  Find a hash bucket.
  const void **Bucket = const_cast<const void**>(FindBucketFor(Ptr));
  if (*Bucket == Ptr)
    return std::make_pair(Bucket, false); // Already inserted, good.

  // Otherwise, insert it!
  if (*Bucket == getTombstoneMarker())
    --NumTombstones;
  else
    ++NumNonEmpty; // Track density.
  *Bucket = Ptr;
  incrementEpoch();
  return std::make_pair(Bucket, true);
}